

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

int Nf_ManExtractWindow(void *pMan,Vec_Int_t *vRoots,Vec_Wec_t *vCuts,Vec_Wec_t *vObjCuts,
                       Vec_Int_t *vSolCuts,Vec_Int_t *vCutGates,Vec_Wrd_t *vCutAreas,word *pInvArea,
                       int StartVar,int nVars)

{
  uint uVar1;
  uint *puVar2;
  undefined1 auVar3 [16];
  Vec_Wec_t *p;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  long *plVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint *puVar17;
  byte bVar18;
  long lVar19;
  undefined8 *puVar20;
  int iVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  Vec_Int_t *vObj [2];
  uint local_e4;
  uint local_e0 [2];
  int local_d8;
  uint local_d4;
  ulong local_d0;
  Vec_Int_t *local_c8;
  ulong local_c0;
  long local_b8;
  Vec_Int_t *local_b0;
  ulong local_a8;
  ulong local_a0;
  uint *local_98;
  int local_90;
  uint local_8c;
  long local_88 [2];
  Vec_Wec_t *local_78;
  ulong local_70;
  Vec_Wec_t *local_68;
  long *local_60;
  long local_58;
  long local_50;
  undefined8 local_48 [3];
  
  local_b0 = vCutGates;
  lVar15 = *pMan;
  lVar14 = *(long *)(lVar15 + 0x48);
  uVar13 = *(uint *)(*(long *)(lVar15 + 0x40) + 4);
  local_c0 = (ulong)uVar13;
  local_c8 = vSolCuts;
  if (nVars < (int)(uVar13 + (~(*(int *)(lVar14 + 4) + uVar13) + *(int *)(lVar15 + 0x18)) * 2)) {
    printf("The number of variables is too large: 2*%d + %d = %d > %d.\n");
    iVar5 = 0;
  }
  else {
    *pInvArea = *(word *)((long)pMan + 0xd0);
    vRoots->nSize = 0;
    if (0 < *(int *)(lVar14 + 4)) {
      lVar19 = 0;
      do {
        iVar5 = *(int *)(*(long *)(lVar14 + 8) + lVar19 * 4);
        if (((long)iVar5 < 0) || (*(int *)(lVar15 + 0x18) <= iVar5)) goto LAB_0078c447;
        if (*(long *)(lVar15 + 0x20) == 0) break;
        puVar20 = (undefined8 *)(*(long *)(lVar15 + 0x20) + (long)iVar5 * 0xc);
        uVar10 = (uint)*puVar20;
        if ((~*(uint *)((long)puVar20 + (ulong)(uVar10 & 0x1fffffff) * -0xc) & 0x9fffffff) == 0) {
          __assert_fail("!Gia_ObjIsCi(Gia_ObjFanin0(pObj))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x89d,
                        "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                       );
        }
        iVar5 = iVar5 - (uVar10 & 0x1fffffff);
        if (iVar5 < 0) {
LAB_0078c330:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(vRoots,iVar5 * 2 + (uint)((uVar10 >> 0x1d & 1) != 0) + uVar13 * -2 + -2);
        lVar19 = lVar19 + 1;
        lVar15 = *pMan;
        lVar14 = *(long *)(lVar15 + 0x48);
      } while (lVar19 < *(int *)(lVar14 + 4));
    }
    auVar3 = _DAT_0093d220;
    iVar5 = vCuts->nSize;
    if (0 < (long)iVar5) {
      pVVar7 = vCuts->pArray;
      lVar14 = (long)iVar5 + -1;
      auVar21._8_4_ = (int)lVar14;
      auVar21._0_8_ = lVar14;
      auVar21._12_4_ = (int)((ulong)lVar14 >> 0x20);
      lVar14 = 0;
      auVar21 = auVar21 ^ _DAT_0093d220;
      auVar27 = _DAT_0093e4e0;
      auVar24 = _DAT_0093d210;
      do {
        auVar26 = auVar24 ^ auVar3;
        iVar23 = auVar21._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar23 && auVar21._0_4_ < auVar26._0_4_ ||
                    iVar23 < auVar26._4_4_) & 1)) {
          *(undefined4 *)((long)&pVVar7->nSize + lVar14) = 0;
        }
        if ((auVar26._12_4_ != auVar21._12_4_ || auVar26._8_4_ <= auVar21._8_4_) &&
            auVar26._12_4_ <= auVar21._12_4_) {
          *(undefined4 *)((long)&pVVar7[1].nSize + lVar14) = 0;
        }
        auVar26 = auVar27 ^ auVar3;
        iVar28 = auVar26._4_4_;
        if (iVar28 <= iVar23 && (iVar28 != iVar23 || auVar26._0_4_ <= auVar21._0_4_)) {
          *(undefined4 *)((long)&pVVar7[2].nSize + lVar14) = 0;
          *(undefined4 *)((long)&pVVar7[3].nSize + lVar14) = 0;
        }
        lVar19 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 4;
        auVar24._8_8_ = lVar19 + 4;
        lVar19 = auVar27._8_8_;
        auVar27._0_8_ = auVar27._0_8_ + 4;
        auVar27._8_8_ = lVar19 + 4;
        lVar14 = lVar14 + 0x40;
      } while ((ulong)(iVar5 + 3U >> 2) << 6 != lVar14);
    }
    vCuts->nSize = 0;
    auVar3 = _DAT_0093d220;
    iVar5 = vObjCuts->nSize;
    if (0 < (long)iVar5) {
      pVVar7 = vObjCuts->pArray;
      lVar14 = (long)iVar5 + -1;
      auVar22._8_4_ = (int)lVar14;
      auVar22._0_8_ = lVar14;
      auVar22._12_4_ = (int)((ulong)lVar14 >> 0x20);
      lVar14 = 0;
      auVar22 = auVar22 ^ _DAT_0093d220;
      auVar26 = _DAT_0093e4e0;
      auVar25 = _DAT_0093d210;
      do {
        auVar27 = auVar25 ^ auVar3;
        iVar23 = auVar22._4_4_;
        if ((bool)(~(auVar27._4_4_ == iVar23 && auVar22._0_4_ < auVar27._0_4_ ||
                    iVar23 < auVar27._4_4_) & 1)) {
          *(undefined4 *)((long)&pVVar7->nSize + lVar14) = 0;
        }
        if ((auVar27._12_4_ != auVar22._12_4_ || auVar27._8_4_ <= auVar22._8_4_) &&
            auVar27._12_4_ <= auVar22._12_4_) {
          *(undefined4 *)((long)&pVVar7[1].nSize + lVar14) = 0;
        }
        auVar27 = auVar26 ^ auVar3;
        iVar28 = auVar27._4_4_;
        if (iVar28 <= iVar23 && (iVar28 != iVar23 || auVar27._0_4_ <= auVar22._0_4_)) {
          *(undefined4 *)((long)&pVVar7[2].nSize + lVar14) = 0;
          *(undefined4 *)((long)&pVVar7[3].nSize + lVar14) = 0;
        }
        lVar19 = auVar25._8_8_;
        auVar25._0_8_ = auVar25._0_8_ + 4;
        auVar25._8_8_ = lVar19 + 4;
        lVar19 = auVar26._8_8_;
        auVar26._0_8_ = auVar26._0_8_ + 4;
        auVar26._8_8_ = lVar19 + 4;
        lVar14 = lVar14 + 0x40;
      } while ((ulong)(iVar5 + 3U >> 2) << 6 != lVar14);
    }
    vObjCuts->nSize = 0;
    local_c8->nSize = 0;
    local_b0->nSize = 0;
    vCutAreas->nSize = 0;
    if (0 < *(int *)(lVar15 + 0x18)) {
      local_d8 = (int)local_c0 * 2 + 2;
      uVar16 = 0;
      pVVar7 = local_c8;
      local_78 = vCuts;
      local_68 = vObjCuts;
      local_60 = (long *)pMan;
      do {
        uVar13 = *(uint *)(*(long *)(lVar15 + 0x20) + uVar16 * 0xc);
        if ((~uVar13 & 0x1fffffff) != 0 && -1 < (int)uVar13) {
          local_e0[0] = 0xffffffff;
          local_d4 = 0xffffffff;
          local_88[0] = 0;
          local_b8 = 0;
          local_a0 = uVar16 * 2;
          plVar8 = local_88;
          puVar9 = local_e0;
          uVar11 = 0;
          bVar4 = true;
          local_d0 = uVar16;
          do {
            bVar12 = bVar4;
            if (*(int *)((long)pMan + 0x5c) <= (int)(uVar11 | local_a0)) goto LAB_0078c3ac;
            if (*(int *)(*(long *)((long)pMan + 0x60) + (uVar11 | local_a0) * 4) != 0) {
              lVar15 = local_d0 * 0x40 + *(long *)((long)pMan + 0x30);
              lVar14 = uVar11 * 0x20;
              uVar13 = *(uint *)(lVar14 + 0x10 + lVar15);
              if (-1 < (int)(uVar13 ^ *(uint *)(lVar14 + lVar15))) {
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              if ((int)*(uint *)(lVar14 + lVar15) < 0) {
                lVar19 = lVar15 + lVar14;
              }
              else {
                lVar19 = 0;
              }
              lVar14 = lVar14 + lVar15 + 0x10;
              if (-1 < (int)uVar13) {
                lVar14 = lVar19;
              }
              if ((*(byte *)(lVar14 + 3) & 0x40) == 0) {
                *plVar8 = lVar14;
              }
              else {
                if (*puVar9 != 0xffffffff) {
                  __assert_fail("iCutInv[c] == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                ,0x8b4,
                                "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                               );
                }
                *puVar9 = pVVar7->nSize;
                Vec_IntPush(pVVar7,-1);
              }
            }
            plVar8 = &local_b8;
            uVar11 = 1;
            puVar9 = &local_d4;
            bVar4 = false;
          } while (bVar12);
          if (vObjCuts->nSize != (int)local_d0 * 2 - local_d8) {
            __assert_fail("Vec_WecSize(vObjCuts) == 2*iObj-LitShift",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x8bc,
                          "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                         );
          }
          puVar20 = local_48;
          uVar13 = 0;
          bVar4 = true;
          do {
            bVar12 = bVar4;
            pVVar7 = Vec_WecPushLevel(vObjCuts);
            *puVar20 = pVVar7;
            iVar5 = (uVar13 | (uint)local_a0) - local_d8;
            if (iVar5 < 0) goto LAB_0078c330;
            Vec_IntPush(pVVar7,iVar5 * 2 + 1);
            uVar13 = 1;
            puVar20 = local_48 + 1;
            bVar4 = false;
          } while (bVar12);
          if ((long)*(int *)((long)pMan + 0x4c) <= (long)local_d0) goto LAB_0078c3ac;
          uVar13 = *(uint *)(*(long *)((long)pMan + 0x50) + local_d0 * 4);
          uVar10 = (int)uVar13 >> 0x10;
          if (((int)uVar10 < 0) || (*(int *)((long)pMan + 0x3c) <= (int)uVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          lVar14 = *(long *)(*(long *)((long)pMan + 0x40) + (ulong)uVar10 * 8);
          uVar16 = (ulong)(uVar13 & 0xffff);
          uVar13 = *(uint *)(lVar14 + uVar16 * 4);
          if (0 < (int)uVar13) {
            puVar9 = (uint *)(lVar14 + uVar16 * 4);
            local_98 = puVar9;
            iVar5 = 0;
            uVar16 = local_d0;
            do {
              puVar17 = puVar9 + 1;
              uVar10 = *puVar17;
              local_a8 = (ulong)uVar10;
              local_e4 = uVar10 & 0x1f;
              if ((local_e4 == 1) && (uVar16 == puVar9[2])) {
                __assert_fail("!Nf_CutIsTriv(pCut, iObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x8c6,
                              "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                             );
              }
              if (**(int **)((long)pMan + 8) < (int)local_e4) {
                __assert_fail("Nf_CutSize(pCut) <= p->pPars->nLutSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x8c7,
                              "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                             );
              }
              if ((int)(uVar10 >> 6) < *(int *)(*(long *)((long)pMan + 0x18) + 4)) {
                lVar14 = *(long *)(*(long *)((long)pMan + 0x18) + 8);
                uVar11 = (ulong)((uVar10 >> 6) << 4);
                if (1 < *(int *)(lVar14 + 4 + uVar11)) {
                  local_a8 = (ulong)(uVar10 >> 5);
                  local_58 = lVar14 + uVar11;
                  local_70 = (ulong)((long)puVar17 - (long)local_98) >> 2;
                  lVar14 = 0;
                  local_90 = iVar5;
                  do {
                    uVar13 = *(uint *)(*(long *)(local_58 + 8) + lVar14 * 4);
                    lVar15 = *(long *)((long)pMan + 0x20);
                    if (local_e4 != *(uint *)(lVar15 + 0x10 + (long)(int)uVar13 * 0x50) >> 0x1c) {
                      __assert_fail("nFans == (int)pC->nFanins",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                    ,0x8d5,
                                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                                   );
                    }
                    uVar10 = *(uint *)(*(long *)(local_58 + 8) + 4 + lVar14 * 4);
                    local_8c = (uVar10 ^ (uint)local_a8) & 1;
                    local_50 = lVar14;
                    Vec_IntPush(local_b0,uVar13);
                    Vec_WrdPush(vCutAreas,*(word *)(lVar15 + (long)(int)uVar13 * 0x50 + 0x18));
                    p = local_78;
                    plVar8 = local_88;
                    uVar16 = local_70;
                    bVar4 = true;
                    do {
                      bVar12 = bVar4;
                      puVar2 = (uint *)*plVar8;
                      if (puVar2 != (uint *)0x0) {
                        if (puVar17 <= local_98) {
                          __assert_fail("pCut > pCutSet",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                                        ,0x93,"int Nf_CutHandle(int *, int *)");
                        }
                        if ((((*puVar2 & 0xfffff) == uVar13) &&
                            ((*puVar2 >> 0x14 & 0x3ff) == (uint)uVar16)) &&
                           (puVar2[1] == (uVar10 & 0xfffffffe))) {
                          Vec_IntPush(local_c8,p->nSize);
                          uVar16 = local_70;
                        }
                      }
                      plVar8 = &local_b8;
                      bVar4 = false;
                    } while (bVar12);
                    iVar5 = p->nSize + StartVar;
                    if (iVar5 < 0) goto LAB_0078c330;
                    pVVar7 = Vec_WecPushLevel(p);
                    uVar13 = local_8c;
                    Vec_IntPush(pVVar7,local_8c | (uint)local_a0);
                    Vec_IntPush((Vec_Int_t *)local_48[uVar13],iVar5 * 2);
                    if (local_e4 != 0) {
                      bVar18 = 0;
                      uVar13 = 0;
                      uVar16 = local_c0;
                      do {
                        uVar6 = (uint)(((uVar10 >> 1 & 0x7f) >> (uVar13 & 0x1f) & 1) != 0);
                        uVar1 = puVar9[(ulong)((uVar10 >> 8) >> (bVar18 & 0x1f) & 0xf) + 2];
                        if ((int)uVar16 < (int)uVar1) {
LAB_0078c0a7:
                          if ((int)uVar1 < 0) goto LAB_0078c330;
                          Vec_IntPush(pVVar7,uVar6 + uVar1 * 2);
                          uVar16 = local_c0;
                        }
                        else if (uVar6 != 0) {
                          uVar6 = 1;
                          goto LAB_0078c0a7;
                        }
                        uVar13 = uVar13 + 1;
                        bVar18 = bVar18 + 4;
                      } while (local_e4 != uVar13);
                    }
                    lVar14 = local_50 + 2;
                    pMan = local_60;
                  } while ((int)((uint)lVar14 | 1) < *(int *)(local_58 + 4));
                  uVar13 = *local_98;
                  local_e4 = *puVar17 & 0x1f;
                  uVar16 = local_d0;
                  vCuts = local_78;
                  iVar5 = local_90;
                }
              }
              iVar5 = iVar5 + 1;
              puVar9 = puVar17 + local_e4;
            } while (iVar5 < (int)uVar13);
          }
          vObjCuts = local_68;
          if ((local_e0[0] != 0xffffffff) && (local_d4 != 0xffffffff)) {
            __assert_fail("iCutInv[0] == -1 || iCutInv[1] == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x8f6,
                          "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                         );
          }
          puVar9 = local_e0;
          uVar13 = 0;
          bVar4 = true;
          do {
            bVar12 = bVar4;
            uVar10 = *puVar9;
            if ((ulong)uVar10 != 0xffffffff) {
              if (((int)uVar10 < 0) || (local_c8->nSize <= (int)uVar10)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              local_c8->pArray[uVar10] = vCuts->nSize;
            }
            uVar13 = uVar13 | (uint)local_a0;
            uVar10 = uVar13 - local_d8;
            if (((int)uVar10 < 0) || (vObjCuts->nSize <= (int)uVar10)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                            ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
            iVar5 = vCuts->nSize + StartVar;
            if (iVar5 < 0) goto LAB_0078c330;
            Vec_IntPush(vObjCuts->pArray + uVar10,iVar5 * 2);
            pVVar7 = Vec_WecPushLevel(vCuts);
            Vec_IntPush(pVVar7,uVar13);
            Vec_IntPush(pVVar7,uVar13 ^ 1);
            Vec_IntPush(local_b0,3);
            Vec_WrdPush(vCutAreas,*(word *)((long)pMan + 0xd0));
            uVar13 = 1;
            puVar9 = &local_d4;
            bVar4 = false;
          } while (bVar12);
          lVar15 = *pMan;
          uVar16 = local_d0;
          pVVar7 = local_c8;
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)*(int *)(lVar15 + 0x18));
    }
    lVar14 = *(long *)(lVar15 + 0x40);
    uVar13 = *(uint *)(lVar14 + 4);
    uVar16 = (ulong)uVar13;
    if (0 < (int)uVar13) {
      iVar5 = 2;
      lVar19 = 0;
      do {
        uVar13 = (uint)uVar16;
        uVar10 = *(uint *)(*(long *)(lVar14 + 8) + lVar19 * 4);
        if (((int)uVar10 < 0) || (*(int *)(lVar15 + 0x18) <= (int)uVar10)) {
LAB_0078c447:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((ulong)uVar10 == 0) break;
        lVar14 = (ulong)uVar10 * 2 + 1;
        if (*(int *)((long)pMan + 0x5c) <= (int)lVar14) {
LAB_0078c3ac:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*(int *)(*(long *)((long)pMan + 0x60) + lVar14 * 4) != 0) {
          Vec_IntPush(local_c8,(uVar13 + *(int *)(*(long *)(lVar15 + 0x48) + 4)) * 2 +
                               *(int *)(lVar15 + 0x18) * -2 + iVar5);
          lVar15 = *pMan;
        }
        lVar19 = lVar19 + 1;
        lVar14 = *(long *)(lVar15 + 0x40);
        uVar13 = *(uint *)(lVar14 + 4);
        uVar16 = (ulong)(int)uVar13;
        iVar5 = iVar5 + -1;
      } while (lVar19 < (long)uVar16);
    }
    if (vCuts->nSize != local_b0->nSize) {
      __assert_fail("Vec_WecSize(vCuts) == Vec_IntSize(vCutGates)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90d,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
    if (vCuts->nSize != vCutAreas->nSize) {
      __assert_fail("Vec_WecSize(vCuts) == Vec_WrdSize(vCutAreas)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90e,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
    iVar5 = (int)local_c0;
    if (vObjCuts->nSize !=
        (~(uVar13 + *(int *)(*(long *)(lVar15 + 0x48) + 4)) + *(int *)(lVar15 + 0x18)) * 2) {
      __assert_fail("Vec_WecSize(vObjCuts) == 2*Gia_ManAndNum(p->pGia)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90f,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
  }
  return iVar5;
}

Assistant:

int Nf_ManExtractWindow( void * pMan, Vec_Int_t * vRoots, Vec_Wec_t * vCuts, Vec_Wec_t * vObjCuts, Vec_Int_t * vSolCuts, Vec_Int_t * vCutGates, Vec_Wrd_t * vCutAreas, word * pInvArea, int StartVar, int nVars )
{
    Nf_Man_t * p = (Nf_Man_t *)pMan;
    int nInputs = Gia_ManCiNum(p->pGia);
    int LitShift = 2*nInputs+2;
    Gia_Obj_t * pObj;
    int c, iObj;
    if ( 2*Gia_ManAndNum(p->pGia) + Gia_ManCiNum(p->pGia) > nVars )
    {
        printf( "The number of variables is too large: 2*%d + %d = %d > %d.\n", Gia_ManAndNum(p->pGia), Gia_ManCiNum(p->pGia), 2*Gia_ManAndNum(p->pGia) + Gia_ManCiNum(p->pGia), nVars );
        return 0;
    }
    *pInvArea = p->InvAreaW;
    // save roots
    Vec_IntClear( vRoots );
    Gia_ManForEachCo( p->pGia, pObj, c )
    {
        assert( !Gia_ObjIsCi(Gia_ObjFanin0(pObj)) );
        Vec_IntPush( vRoots, Gia_ObjFaninLit0p(p->pGia, pObj)-LitShift );
    }
    // prepare
    Vec_WecClear( vCuts );
    Vec_WecClear( vObjCuts );
    Vec_IntClear( vSolCuts );
    Vec_IntClear( vCutGates );
    Vec_WrdClear( vCutAreas );
    // collect cuts for each node
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_Int_t * vObj[2], * vCutOne;
        int iCut, * pCut, * pCutSet;
        int iCutInv[2] = {-1, -1};
        // get matches
        Nf_Mat_t * pM[2] = {NULL, NULL};
        for ( c = 0; c < 2; c++ )
        {
            if ( Nf_ObjMapRefNum(p, iObj, c) == 0 )
                continue;
            if ( Nf_ObjMatchBest(p, iObj, c)->fCompl )
            {
                assert( iCutInv[c] == -1 );
                iCutInv[c] = Vec_IntSize(vSolCuts);
                Vec_IntPush( vSolCuts, -1 );
                continue;
            }
            pM[c] = Nf_ObjMatchBest(p, iObj, c);
        }
        // start collecting cuts of pos-obj and neg-obj
        assert( Vec_WecSize(vObjCuts) == 2*iObj-LitShift );
        for ( c = 0; c < 2; c++ )
        {
            vObj[c] = Vec_WecPushLevel( vObjCuts );
            Vec_IntPush( vObj[c], Abc_Var2Lit(Abc_Var2Lit(iObj, c)-LitShift, 1) );
        }
        // enumerate cuts
        pCutSet = Nf_ObjCutSet( p, iObj );
        Nf_SetForEachCut( pCutSet, pCut, iCut )
        {
            assert( !Nf_CutIsTriv(pCut, iObj) );
            assert( Nf_CutSize(pCut) <= p->pPars->nLutSize );
            if ( Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match) )
            {
                int * pFans      = Nf_CutLeaves(pCut);
                int nFans        = Nf_CutSize(pCut);
                int iFuncLit     = Nf_CutFunc(pCut);
                int fComplExt    = Abc_LitIsCompl(iFuncLit);
                Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
                int i, k, c, Info, Offset, iFanin, fComplF, iCutLit;
                Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
                {
                    Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
                    int fCompl     = Cfg.fCompl ^ fComplExt;
                    Mio_Cell2_t*pC = Nf_ManCell( p, Info );
                    assert( nFans == (int)pC->nFanins );
                    Vec_IntPush( vCutGates, Info );
                    Vec_WrdPush( vCutAreas, pC->AreaW );
                    // to make comparison possible
                    Cfg.fCompl = 0;
                    // add solution cut
                    for ( c = 0; c < 2; c++ )
                    {
                        if ( pM[c] == NULL )
                            continue;
                        if ( (int)pM[c]->CutH == Nf_CutHandle(pCutSet, pCut) && (int)pM[c]->Gate == Info && Nf_Cfg2Int(pM[c]->Cfg) == Nf_Cfg2Int(Cfg) )
                        {
                            Vec_IntPush( vSolCuts, Vec_WecSize(vCuts) );
                            //printf( "adding solution for %d\n", Abc_Var2Lit(iObj, c)-LitShift );
                        }
                    }
                    // add new cut
                    iCutLit = Abc_Var2Lit( StartVar + Vec_WecSize(vCuts), 0 );
                    vCutOne = Vec_WecPushLevel( vCuts );
                    // add literals
                    Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, fCompl) );
                    Vec_IntPush( vObj[fCompl], iCutLit );
                    Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
                        if ( pFans[iFanin] >= nInputs + 1 ) // internal node
                        {
                            Vec_IntPush( vCutOne, Abc_Var2Lit(pFans[iFanin], fComplF) );
                            //Vec_IntPush( Vec_WecEntry(vObjCuts, Abc_Var2Lit(pFans[iFanin], fComplF)-LitShift), iCutLit );
                        }
                        else if ( fComplF ) // complemented primary input
                            Vec_IntPush( vCutOne, Abc_Var2Lit(pFans[iFanin], 1) );
                } 
            }
        }
        assert( iCutInv[0] == -1 || iCutInv[1] == -1 );
        // add inverter cut
        for ( c = 0; c < 2; c++ )
        {
            if ( iCutInv[c] != -1 )
                Vec_IntWriteEntry( vSolCuts, iCutInv[c], Vec_WecSize(vCuts) );
            // the obj-lit implies its cut
            Vec_IntPush( Vec_WecEntry(vObjCuts, Abc_Var2Lit(iObj, c)-LitShift), Abc_Var2Lit(StartVar + Vec_WecSize(vCuts), 0) );
            // the cut includes both literals
            vCutOne = Vec_WecPushLevel( vCuts );
            Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, c) );
            Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, !c) );
            Vec_IntPush( vCutGates, 3 );
            Vec_WrdPush( vCutAreas, p->InvAreaW );
        }
    }
//    for ( c = 0; c < p->nCells; c++ )
//        printf( "%d=%s ", c, p->pCells[c].pName );
//    printf( "\n" );
    // add complemented inputs
    Gia_ManForEachCiId( p->pGia, iObj, c )
        if ( Nf_ObjMapRefNum(p, iObj, 1) )
            Vec_IntPush( vSolCuts, -(2*Gia_ManAndNum(p->pGia)+c) );
    assert( Vec_WecSize(vCuts) == Vec_IntSize(vCutGates) );
    assert( Vec_WecSize(vCuts) == Vec_WrdSize(vCutAreas) );
    assert( Vec_WecSize(vObjCuts) == 2*Gia_ManAndNum(p->pGia) );
    return nInputs;
}